

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O3

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,size_t nb_summaries,CaptureSummary **cs)

{
  uint uVar1;
  CaptureLine *x;
  pointer pp_Var2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  _capture_line *p_Var8;
  _capture_line **pp_Var9;
  _capture_line **pp_Var10;
  ulong uVar11;
  size_type __n;
  pointer pp_Var12;
  size_type sVar13;
  bool bVar14;
  long lVar15;
  int i;
  uint64_t uVar16;
  ulong uVar17;
  CaptureSummary *pCVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> complete;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> frequent_tld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> leaked_2ld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> leaked_tld;
  CaptureLine *tld_line;
  CaptureLine current_line;
  uint64_t skipped_tld_length [64];
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> local_498;
  CaptureSummary *local_478;
  char *local_470;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> local_468;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> local_448;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> local_428;
  _capture_line *local_410;
  size_t local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  ulong local_3e8;
  char *local_3e0;
  _capture_line *local_3d8 [8];
  int local_398;
  anon_union_128_2_8b70880b_for__capture_line_2 local_394;
  uint64_t local_310;
  CaptureLine local_308;
  uint64_t local_238 [65];
  
  local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (_capture_line **)0x0;
  local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (_capture_line **)0x0;
  local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (_capture_line **)0x0;
  local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (_capture_line **)0x0;
  local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (_capture_line **)0x0;
  local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (_capture_line **)0x0;
  local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (_capture_line **)0x0;
  local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (_capture_line **)0x0;
  local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (_capture_line **)0x0;
  local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (_capture_line **)0x0;
  local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (_capture_line **)0x0;
  local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (_capture_line **)0x0;
  local_478 = this;
  local_408 = nb_summaries;
  local_410 = (_capture_line *)operator_new(0xd0);
  memset(local_238,0,0x200);
  local_400 = DnsStats::GetTableName(0x1d);
  local_3e0 = DnsStats::GetTableName(0x38);
  local_3f8 = DnsStats::GetTableName(0x26);
  local_3f0 = DnsStats::GetTableName(0x28);
  local_470 = DnsStats::GetTableName(0x1c);
  pcVar4 = DnsStats::GetTableName(0x3a);
  pcVar5 = DnsStats::GetTableName(0x39);
  bVar20 = local_410 != (_capture_line *)0x0;
  bVar21 = pcVar4 != (char *)0x0;
  bVar22 = pcVar5 != (char *)0x0;
  auVar25._0_4_ = -(uint)((int)((ulong)local_400 >> 0x20) == 0 && (int)local_400 == 0);
  auVar25._4_4_ = -(uint)((int)local_3f8 == 0 && (int)((ulong)local_3f8 >> 0x20) == 0);
  auVar25._8_4_ = -(uint)((int)((ulong)local_3f0 >> 0x20) == 0 && (int)local_3f0 == 0);
  auVar25._12_4_ = -(uint)((int)local_470 == 0 && (int)((ulong)local_470 >> 0x20) == 0);
  iVar3 = movmskps((int)pcVar5,auVar25);
  bVar23 = iVar3 == 0;
  bVar14 = ((bVar22 && bVar21) && bVar20) && bVar23;
  bVar24 = local_408 == 0;
  if (bVar24 || (((!bVar22 || !bVar21) || !bVar20) || !bVar23)) {
    sVar13 = 0;
    local_3e8 = 0;
  }
  else {
    local_3e8 = 0;
    sVar13 = 0;
    uVar6 = 0;
    do {
      uVar11 = (long)(cs[uVar6]->summary).
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(cs[uVar6]->summary).
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (local_3e8 < uVar11) {
        local_3e8 = uVar11;
      }
      sVar13 = sVar13 + uVar11;
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_408);
  }
  if (((bVar22 && bVar21) && bVar20) && bVar23) {
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve(&local_498,sVar13);
    __n = local_408 * 0x10;
    sVar13 = local_408 * 0x30;
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve(&local_428,sVar13);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve(&local_448,sVar13);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve(&local_468,__n);
    if (!bVar24 && (((bVar22 && bVar21) && bVar20) && bVar23)) {
      uVar6 = 0;
      uVar16 = 0;
      do {
        pp_Var12 = (cs[uVar6]->summary).
                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((cs[uVar6]->summary).
            super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish != pp_Var12) {
          uVar11 = 0;
          do {
            p_Var8 = pp_Var12[uVar11];
            iVar3 = strcmp(p_Var8->registry_name,local_3f8);
            if (iVar3 == 0) {
              sVar7 = strlen((p_Var8->field_2).key_value);
              bVar20 = DnsStats::IsFrequentLeakTld((uint8_t *)(p_Var8->field_2).key_value,sVar7);
              pp_Var12 = (cs[uVar6]->summary).
                         super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar11;
              if (bVar20) {
                if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  *local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish = *pp_Var12;
                  goto LAB_00152318;
                }
LAB_00152320:
                std::vector<_capture_line*,std::allocator<_capture_line*>>::
                _M_realloc_insert<_capture_line*const&>
                          ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_498,
                           (iterator)
                           local_498.
                           super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish,pp_Var12);
              }
              else {
                uVar16 = uVar16 + (*pp_Var12)->count;
              }
            }
            else {
              pp_Var12 = pp_Var12 + uVar11;
              iVar3 = strcmp(p_Var8->registry_name,local_400);
              if ((iVar3 == 0) && (p_Var8->count < 5)) {
                sVar7 = strlen((p_Var8->field_2).key_value);
                if (sVar7 < 0x40) {
                  local_238[sVar7] = local_238[sVar7] + 1;
                }
              }
              else {
                if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00152320;
                *local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = p_Var8;
LAB_00152318:
                local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar11 = uVar11 + 1;
            pp_Var12 = (cs[uVar6]->summary).
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
          } while (uVar11 < (ulong)((long)(cs[uVar6]->summary).
                                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pp_Var12 >> 3));
        }
        pcVar4 = local_3f0;
        p_Var8 = local_410;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_408);
      if (bVar14 && uVar16 != 0) {
        local_410->count = uVar16;
        *(undefined8 *)&local_410->key_type = 0;
        sVar7 = strlen(local_3f0);
        memcpy(p_Var8,pcVar4,sVar7 + 1);
        if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<_capture_line*,std::allocator<_capture_line*>>::
          _M_realloc_insert<_capture_line*const&>
                    ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_498,
                     (iterator)
                     local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_410);
        }
        else {
          *local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_410;
          local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
    }
  }
  pp_Var2 = local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pp_Var12 = local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar19 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)CaptureLineIsLower);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var12,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var2,
               (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)CaptureLineIsLower);
  }
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
            (&local_478->summary,local_3e8 + local_408 * 0x40);
  if (bVar14) {
    pcVar4 = local_470;
    if ((long)local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      uVar11 = (long)local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      uVar6 = 0;
      do {
        pp_Var12 = local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        memcpy(&local_308,
               local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6],0xd0);
        uVar17 = uVar6 + 1;
        uVar6 = uVar17;
        if (uVar17 < uVar11) {
          do {
            uVar16 = local_308.count;
            x = pp_Var12[uVar17];
            bVar20 = CaptureLineIsSameKey(x,&local_308);
            pcVar4 = local_470;
            uVar6 = uVar17;
            if (!bVar20) break;
            local_308.count = uVar16 + x->count;
            uVar17 = uVar17 + 1;
            uVar6 = uVar11;
          } while (uVar11 != uVar17);
        }
        iVar3 = strcmp(local_308.registry_name,local_400);
        if (iVar3 == 0) {
          p_Var8 = (_capture_line *)operator_new(0xd0);
          local_3d8[0] = p_Var8;
          memcpy(p_Var8,&local_308,0xd0);
          if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<_capture_line*,std::allocator<_capture_line*>>::
            _M_realloc_insert<_capture_line*const&>
                      ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_428,
                       (iterator)
                       local_428.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_finish,local_3d8);
          }
          else {
            *local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
             .super__Vector_impl_data._M_finish = p_Var8;
            local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          iVar3 = strcmp(local_308.registry_name,local_3e0);
          if (iVar3 == 0) {
            p_Var8 = (_capture_line *)operator_new(0xd0);
            local_3d8[0] = p_Var8;
            memcpy(p_Var8,&local_308,0xd0);
            if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<_capture_line*,std::allocator<_capture_line*>>::
              _M_realloc_insert<_capture_line*const&>
                        ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_448,
                         (iterator)
                         local_448.
                         super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,local_3d8);
            }
            else {
              *local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_finish = p_Var8;
              local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            iVar3 = strcmp(local_308.registry_name,local_3f8);
            if (iVar3 == 0) {
              p_Var8 = (_capture_line *)operator_new(0xd0);
              local_3d8[0] = p_Var8;
              memcpy(p_Var8,&local_308,0xd0);
              if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<_capture_line*,std::allocator<_capture_line*>>::
                _M_realloc_insert<_capture_line*const&>
                          ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_468,
                           (iterator)
                           local_468.
                           super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish,local_3d8);
              }
              else {
                *local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = p_Var8;
                local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              AddLine(local_478,&local_308,true);
            }
          }
        }
        uVar11 = (long)local_498.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_498.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3;
      } while (uVar6 < uVar11);
    }
    pp_Var2 = local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pp_Var12 = local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pCVar18 = local_478;
    if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar6 = (long)local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar19 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                 CaptureLineIsLargerCount);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )pp_Var12,
                 (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )pp_Var2,
                 (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                 CaptureLineIsLargerCount);
      pcVar4 = local_470;
      pCVar18 = local_478;
      if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 0;
        do {
          AddLine(pCVar18,local_468.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6],true);
          if (0xfe < uVar6) break;
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)local_468.
                                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_468.
                                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    pp_Var2 = local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pp_Var12 = local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar6 = (long)local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar19 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                 CaptureLineIsLargerCount);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )pp_Var12,
                 (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )pp_Var2,
                 (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                 CaptureLineIsLargerCount);
      pcVar4 = local_470;
      pCVar18 = local_478;
      if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 0;
        do {
          AddLine(pCVar18,local_448.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6],true);
          if (0xfe < uVar6) break;
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)local_448.
                                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_448.
                                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    pp_Var2 = local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pp_Var12 = local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar6 = (long)local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar19 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                 CaptureLineIsLargerCount);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )pp_Var12,
                 (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )pp_Var2,
                 (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                 CaptureLineIsLargerCount);
      pcVar4 = local_470;
      pCVar18 = local_478;
      if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 0;
        do {
          AddLine(pCVar18,local_428.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6],true);
          if (0xfe < uVar6) break;
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)local_428.
                                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_428.
                                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    pp_Var12 = (pCVar18->summary).
               super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    lVar19 = (long)(pCVar18->summary).
                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pp_Var12;
    if (lVar19 != 0) {
      lVar19 = lVar19 >> 3;
      lVar15 = 0;
      do {
        p_Var8 = pp_Var12[lVar15];
        iVar3 = strcmp(p_Var8->registry_name,pcVar4);
        if ((iVar3 == 0) && (uVar1 = (p_Var8->field_2).key_number, uVar1 - 1 < 0x3f)) {
          p_Var8->count = p_Var8->count + local_238[uVar1];
          local_238[uVar1] = 0;
        }
        lVar15 = lVar15 + 1;
      } while (lVar19 + (ulong)(lVar19 == 0) != lVar15);
    }
    pCVar18 = local_478;
    lVar19 = 0;
    do {
      if (local_238[lVar19] != 0) {
        local_398 = 0;
        local_394.key_number = (int)lVar19;
        local_310 = local_238[lVar19];
        sVar7 = strlen(pcVar4);
        memcpy((CaptureLine *)local_3d8,pcVar4,sVar7 + 1);
        AddLine(pCVar18,(CaptureLine *)local_3d8,true);
        local_238[lVar19] = 0;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x40);
    Sort(pCVar18);
  }
  if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    pp_Var9 = local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pp_Var10 = local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pp_Var9[uVar6] != (_capture_line *)0x0) {
        operator_delete(pp_Var9[uVar6]);
        local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = (_capture_line *)0x0;
        pp_Var9 = local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pp_Var10 = local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)pp_Var10 - (long)pp_Var9 >> 3));
  }
  if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    pp_Var9 = local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pp_Var10 = local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pp_Var9[uVar6] != (_capture_line *)0x0) {
        operator_delete(pp_Var9[uVar6]);
        local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = (_capture_line *)0x0;
        pp_Var9 = local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pp_Var10 = local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)pp_Var10 - (long)pp_Var9 >> 3));
  }
  if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    pp_Var9 = local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pp_Var10 = local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pp_Var9[uVar6] != (_capture_line *)0x0) {
        operator_delete(pp_Var9[uVar6]);
        local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = (_capture_line *)0x0;
        pp_Var9 = local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pp_Var10 = local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)pp_Var10 - (long)pp_Var9 >> 3));
  }
  if (local_410 != (_capture_line *)0x0) {
    operator_delete(local_410);
  }
  if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_capture_line **)0x0) {
    operator_delete(local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_capture_line **)0x0) {
    operator_delete(local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_capture_line **)0x0) {
    operator_delete(local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_capture_line **)0x0) {
    operator_delete(local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar14;
}

Assistant:

bool CaptureSummary::Merge(size_t nb_summaries, CaptureSummary ** cs)
{
    bool ret = true;
    size_t max_size = 0;
    size_t complete_size = 0;
    std::vector<CaptureLine *> complete;
    std::vector<CaptureLine *> leaked_tld;
    std::vector<CaptureLine*> leaked_2ld;
    std::vector<CaptureLine *> frequent_tld;
    char const * leak_tld_id = NULL;
    char const * leak_2ld_id = NULL;
    char const * frequent_tld_id = NULL;
    char const * local_tld_id = NULL;
    char const * leak_by_length_id = NULL;
    char const* name_list_id = NULL;
    char const* addr_list_id = NULL;
    CaptureLine current_line;
    uint64_t nb_locally_leaked_tld = 0;
    CaptureLine *local_leak = new CaptureLine;
    uint64_t skipped_tld_length[64];

    memset(skipped_tld_length, 0, sizeof(skipped_tld_length));

    if (ret)
    {
        leak_tld_id = DnsStats::GetTableName(REGISTRY_DNS_LeakedTLD);
        leak_2ld_id = DnsStats::GetTableName(REGISTRY_DNS_LEAK_2NDLEVEL);
        frequent_tld_id = DnsStats::GetTableName(REGISTRY_DNS_Frequent_TLD_Usage);
        local_tld_id = DnsStats::GetTableName(REGISTRY_DNS_Local_TLD_Usage_Count);
        leak_by_length_id = DnsStats::GetTableName(REGISTRY_DNS_LeakByLength);
        name_list_id = DnsStats::GetTableName(REGISTRY_DNS_ERRONEOUS_NAME_LIST);
        addr_list_id = DnsStats::GetTableName(REGISTRY_DNS_ADDRESS_LIST);

        ret = (leak_tld_id != NULL && frequent_tld_id != NULL && local_tld_id != NULL && leak_by_length_id != NULL && local_leak != NULL
            && name_list_id != NULL && addr_list_id != NULL);
    }

    /* Compute the plausible max size and the complete size */
    for (size_t i = 0; ret && i < nb_summaries; i++)
    {
        if (cs[i]->Size() > max_size)
        {
            max_size = cs[i]->Size();
        }

        complete_size += cs[i]->Size();
    }

    /* Create a complete list that contains all the summaries */
    if (ret)
    {
        complete.reserve(complete_size);
        leaked_tld.reserve(48 * nb_summaries);
        leaked_2ld.reserve(48 * nb_summaries);
        frequent_tld.reserve(16 * nb_summaries);
    }

    for (size_t i = 0; ret && i < nb_summaries; i++) {
        for (size_t j = 0; j < cs[i]->Size(); j++) {
            if (strcmp(cs[i]->summary[j]->registry_name, frequent_tld_id) == 0)
            {
                /* This is a TLD "frequently used" by a client. We will only consider it in the summary
                 * if it is part of the TLD frequently leaked to the root.
                 */  
                if (DnsStats::IsFrequentLeakTld((uint8_t *)cs[i]->summary[j]->key_value,
                    strlen(cs[i]->summary[j]->key_value))) {
                    complete.push_back(cs[i]->summary[j]);
                }
                else
                {
                    nb_locally_leaked_tld += cs[i]->summary[j]->count;
                }
            }
            else if (strcmp(cs[i]->summary[j]->registry_name, leak_tld_id) == 0)
            {
                /* This is a TLD "frequently leaked" to the root */
                if (cs[i]->summary[j]->count <= 4)
                {
                    size_t len = strlen(cs[i]->summary[j]->key_value);

                    if (len < 64)
                    {
                        skipped_tld_length[len]++;
                    }
                }
                else
                {
                    complete.push_back(cs[i]->summary[j]);
                }
            }
            /* TODO: if local leak present, add to total */
            else
            {
                complete.push_back(cs[i]->summary[j]);
            }
        }
    }

    if (ret && nb_locally_leaked_tld != 0)
    {
        local_leak->count = nb_locally_leaked_tld;
        local_leak->key_type = 0;
        local_leak->key_number = 0; 
        
        memcpy(local_leak->registry_name, local_tld_id, strlen(local_tld_id) + 1);

        complete.push_back(local_leak);
    }

    /* Sort the complete list */
    std::sort(complete.begin(), complete.end(), CaptureLineIsLower);

    /* Now go through the list and perform the summations.
     * Put the frequent tld, 2nd ld and tls usage in separate lists */
    Reserve(max_size + 64* nb_summaries);

    for (size_t i = 0; ret && i < complete.size();) {
        /* Read the next capture line */
        current_line = *complete[i++];

        /* Summarize all matching lines */
        while (i < complete.size() && CaptureLineIsSameKey(complete[i], &current_line)) {
            current_line.count += complete[i]->count;
            i++;
        }

        /* Add line to summary, or to one of the special registries */

        if (strcmp(current_line.registry_name, leak_tld_id) == 0) {
            CaptureLine *tld_line = new CaptureLine;

            if (tld_line != NULL)
            {
                memcpy(tld_line, &current_line, sizeof(CaptureLine));
                leaked_tld.push_back(tld_line);
            }
            else
            {
                ret = false;
            }
        }
        else if (strcmp(current_line.registry_name, leak_2ld_id) == 0) {
            CaptureLine* second_ld_line = new CaptureLine;

            if (second_ld_line != NULL)
            {
                memcpy(second_ld_line, &current_line, sizeof(CaptureLine));
                leaked_2ld.push_back(second_ld_line);
            }
            else
            {
                ret = false;
            }
        }
        else if (strcmp(current_line.registry_name, frequent_tld_id) == 0) {
            CaptureLine *tld_line = new CaptureLine;

            if (tld_line != NULL)
            {
                memcpy(tld_line, &current_line, sizeof(CaptureLine));
                frequent_tld.push_back(tld_line);
            }
            else
            {
                ret = false;
            }
        }
        else {
            AddLine(&current_line, true);
        }
    }

    /* Sort and tabulate the most used TLD. */
    if (ret) {
        std::sort(frequent_tld.begin(), frequent_tld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < frequent_tld.size() && i < 256; i++) {
            AddLine(frequent_tld[i], true);
        }
    }

    /* Sort and tabulate the most used 2LD. */
    if (ret) {
        std::sort(leaked_2ld.begin(), leaked_2ld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < leaked_2ld.size() && i < 256; i++) {
            AddLine(leaked_2ld[i], true);
        }
    }

    /* Sort and tabulate the most leaked TLD. 
     * TODO: tabulate the length of the discarded TLD, and correct the captured values */
    if (ret) {
        std::sort(leaked_tld.begin(), leaked_tld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < leaked_tld.size() && i < 256; i++) {
            AddLine(leaked_tld[i], true);
        }

        for (size_t i = 256; i < leaked_tld.size() && i < 256; i++) {
            size_t len = strlen(leaked_tld[i]->key_value);

            if (len < 64)
            {
                skipped_tld_length[len]++;
            }
        }
    }

    if (ret) {
        /* Add the leaked length to the current counts */
        for (size_t i = 0; i < summary.size(); i++)
        {
            if (strcmp(summary[i]->registry_name, leak_by_length_id) == 0 &&
                summary[i]->key_number > 0 &&
                summary[i]->key_number < 64)
            {
                summary[i]->count += skipped_tld_length[summary[i]->key_number];
                skipped_tld_length[summary[i]->key_number] = 0;
            }
        }

        for (int i = 0; i < 64; i++)
        {
            if (skipped_tld_length[i] != 0)
            {
                CaptureLine length_pattern;

                length_pattern.count = skipped_tld_length[i];
                length_pattern.key_type = 0;
                length_pattern.key_number = i;

                memcpy(length_pattern.registry_name, leak_by_length_id, strlen(leak_by_length_id) + 1);

                AddLine(&length_pattern, true);
                skipped_tld_length[i] = 0;
            }
        }
    }

    if (ret) {
        /* Sort the whole thing again */
        Sort();
    }

    /* Clean up */

    for (size_t i = 0; i < frequent_tld.size(); i++)
    {
        if (frequent_tld[i] != NULL)
        {
            delete frequent_tld[i];
            frequent_tld[i] = NULL;
        }
    }

    for (size_t i = 0; i < leaked_tld.size(); i++)
    {
        if (leaked_tld[i] != NULL)
        {
            delete leaked_tld[i];
            leaked_tld[i] = NULL;
        }
    }

    for (size_t i = 0; i < leaked_2ld.size(); i++)
    {
        if (leaked_2ld[i] != NULL)
        {
            delete leaked_2ld[i];
            leaked_2ld[i] = NULL;
        }
    }

    if (local_leak != NULL)
    {
        delete local_leak;
        local_leak = NULL;
    }

    return ret;
}